

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O2

void init_sound(void)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  ALLEGRO_SAMPLE_INSTANCE *pAVar5;
  char cVar6;
  uint uVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined8 uVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  undefined1 uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  undefined1 local_58 [8];
  double dStack_50;
  
  cVar6 = al_is_audio_installed();
  if (cVar6 == '\0') {
    return;
  }
  zap = create_sample_u8(0x5622,0x2000);
  puVar8 = (undefined1 *)al_get_sample_data(zap);
  fVar16 = 0.02;
  fVar19 = 0.025;
  fVar17 = 0.0;
  _local_58 = ZEXT816(0);
  iVar13 = 0x2000;
  while (iVar13 != 0) {
    dVar18 = fmod((double)fVar17,1.0);
    dVar2 = fmod((double)(float)local_58._0_4_,1.0);
    *puVar8 = (char)(int)((double)((float)iVar13 * 0.00012207031 * 127.0) * (dVar2 + dVar18 + -1.0)
                         + 128.0);
    fVar17 = fVar17 + fVar16;
    local_58._0_4_ = (float)local_58._0_4_ + fVar19;
    fVar16 = fVar16 + -1e-06;
    fVar19 = fVar19 + -1.25e-06;
    puVar8 = puVar8 + 1;
    iVar13 = iVar13 + -1;
  }
  bang = create_sample_u8(0x5622,0x2000);
  puVar8 = (undefined1 *)al_get_sample_data(bang);
  fVar16 = 0.0;
  iVar13 = 0x2000;
  while( true ) {
    if (iVar13 == 0) break;
    local_58._0_4_ = (float)iVar13 * 0.00012207031 * 255.0;
    uVar7 = rand();
    fVar16 = fVar16 * 0.75 + ((float)(uVar7 & 0xff) / 255.0 + -0.5) * 0.25;
    *puVar8 = (char)(int)((float)local_58._0_4_ * fVar16 + 128.0);
    puVar8 = puVar8 + 1;
    iVar13 = iVar13 + -1;
  }
  iVar13 = 0x6000;
  bigbang = create_sample_u8(0x2b11,0x6000);
  lVar9 = al_get_sample_data(bigbang);
  fVar16 = 0.0;
  fVar19 = 0.0;
  auVar4._12_4_ = 0;
  auVar4._0_12_ = stack0xffffffffffffffac;
  _local_58 = auVar4 << 0x20;
  for (lVar15 = 0; (int)lVar15 != 0x6000; lVar15 = lVar15 + 1) {
    fVar17 = ((float)(int)lVar15 / 24576.0) * 0.4 + 0.5;
    dVar18 = (double)((float)local_58._0_4_ * fVar17);
    local_58 = (undefined1  [8])dVar18;
    uVar7 = rand();
    fVar17 = (float)((double)(1.0 - fVar17) * ((double)(uVar7 & 0xff) / 255.0 + -0.5) + dVar18);
    local_58._0_4_ = fVar17;
    dVar18 = sin((double)fVar16);
    dVar2 = sin((double)fVar19);
    *(char *)(lVar9 + lVar15) =
         (char)(int)((double)(((float)iVar13 / 24576.0) * 128.0) *
                     ((dVar2 + dVar18) * 0.25 + (double)fVar17) + 128.0);
    fVar16 = (float)((double)fVar16 + 0.03);
    fVar19 = (float)((double)fVar19 + 0.04);
    iVar13 = iVar13 + -1;
  }
  ping = create_sample_u8(0x5622,0x2000);
  puVar8 = (undefined1 *)al_get_sample_data(ping);
  fVar16 = 0.0;
  fVar19 = 0.0;
  iVar13 = 0x2000;
  while (iVar13 != 0) {
    dVar18 = (double)fVar16;
    auVar1._8_4_ = SUB84((double)fVar19,0);
    auVar1._0_8_ = dVar18;
    auVar1._12_4_ = (int)((ulong)(double)fVar19 >> 0x20);
    dVar2 = sin(dVar18);
    dStack_50 = auVar1._8_8_;
    dVar3 = sin(dStack_50);
    *puVar8 = (char)(int)((double)((float)iVar13 * 0.00012207031 * 31.0) * (dVar3 + dVar2 + -1.0) +
                         128.0);
    fVar16 = (float)(dVar18 + 0.2);
    fVar19 = (float)(dStack_50 + 0.3);
    puVar8 = puVar8 + 1;
    iVar13 = iVar13 + -1;
  }
  ping_timer = (ALLEGRO_TIMER *)al_create_timer(0x33333333);
  if (no_music == 0) {
    cVar6 = al_is_audio_installed();
    if (cVar6 != '\0') {
      sine = create_sample_u8(0x5622,0x40);
      lVar9 = al_get_sample_data(sine);
      dVar18 = 0.0;
      for (lVar15 = 0; (int)lVar15 != 0x40; lVar15 = lVar15 + 1) {
        dVar2 = sin(dVar18 * 3.141592653589793 * 0.03125);
        dVar3 = sin((dVar18 * 3.141592653589793) / 12.0);
        *(char *)(lVar9 + lVar15) = (char)(int)((dVar3 + dVar2) * 8.0 + 128.0);
        dVar18 = dVar18 + 1.0;
      }
      square = create_sample_u8(0x5622,0x40);
      lVar9 = al_get_sample_data(square);
      for (lVar15 = 0; (uint)lVar15 != 0x40; lVar15 = lVar15 + 1) {
        uVar14 = 0x88;
        if ((uint)lVar15 < 0x20) {
          uVar14 = 0x78;
        }
        *(undefined1 *)(lVar9 + lVar15) = uVar14;
      }
      saw = create_sample_u8(0x5622,0x40);
      lVar9 = al_get_sample_data(saw);
      for (uVar11 = 0; (int)uVar11 != 0x40; uVar11 = uVar11 + 1) {
        *(char *)(lVar9 + uVar11) = (char)(uVar11 >> 2) + 'x';
      }
      bd = create_sample_u8(0x5622,0x400);
      puVar8 = (undefined1 *)al_get_sample_data(bd);
      dVar18 = 0.0;
      iVar13 = 0x400;
      while (iVar13 != 0) {
        dVar2 = sin(dVar18 / 48.0);
        dVar3 = sin(dVar18 * 0.03125);
        *puVar8 = (char)(int)((double)((float)iVar13 * 0.0625) * (dVar3 + dVar2) + 128.0);
        puVar8 = puVar8 + 1;
        dVar18 = dVar18 + 1.0;
        iVar13 = iVar13 + -1;
      }
      snare = create_sample_u8(0x5622,0xc00);
      puVar8 = (undefined1 *)al_get_sample_data(snare);
      fVar16 = 0.0;
      iVar13 = 0xc00;
      while (iVar13 != 0) {
        uVar7 = rand();
        fVar16 = fVar16 * 0.9 + ((float)(uVar7 & 0xff) / 255.0 + -0.5) * 0.1;
        *puVar8 = (char)(int)(((float)iVar13 / 24.0) * fVar16 + 128.0);
        puVar8 = puVar8 + 1;
        iVar13 = iVar13 + -1;
      }
      hihat = create_sample_u8(0x5622,0x400);
      puVar8 = (undefined1 *)al_get_sample_data(hihat);
      dVar18 = 0.0;
      iVar13 = 0x400;
      while (iVar13 != 0) {
        dVar2 = sin(dVar18 / 4.2);
        uVar7 = rand();
        *puVar8 = (char)(int)((double)((float)iVar13 / 192.0) *
                              ((double)(uVar7 & 0xff) / 255.0 + -0.5 + dVar2) + 128.0);
        puVar8 = puVar8 + 1;
        dVar18 = dVar18 + 1.0;
        iVar13 = iVar13 + -1;
      }
      piVar12 = freq_table;
      for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
        dVar18 = exp2((double)(int)lVar9 / 12.0);
        *piVar12 = (int)(dVar18 * 350.0);
        piVar12 = piVar12 + 1;
      }
      piVar12 = part_time;
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 8) {
        *piVar12 = 0;
        *(undefined8 *)((long)part_pos + lVar9) = *(undefined8 *)((long)part_ptr + lVar9);
        piVar12 = piVar12 + 1;
      }
      part_voice[0] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(sine);
      part_voice[1] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(square);
      part_voice[2] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(saw);
      part_voice[3] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(bd);
      pAVar5 = part_voice[0];
      uVar10 = al_get_default_mixer();
      al_attach_sample_instance_to_mixer(pAVar5,uVar10);
      pAVar5 = part_voice[1];
      uVar10 = al_get_default_mixer();
      al_attach_sample_instance_to_mixer(pAVar5,uVar10);
      pAVar5 = part_voice[2];
      uVar10 = al_get_default_mixer();
      al_attach_sample_instance_to_mixer(pAVar5,uVar10);
      pAVar5 = part_voice[3];
      uVar10 = al_get_default_mixer();
      al_attach_sample_instance_to_mixer(pAVar5,uVar10);
      al_set_sample_instance_playmode(part_voice[0],0x101);
      al_set_sample_instance_playmode(part_voice[1],0x101);
      al_set_sample_instance_playmode(part_voice[2],0x101);
      al_set_sample_instance_playmode(part_voice[3],0x100);
      al_set_sample_instance_gain(0x3f40c0c1,part_voice[0]);
      al_set_sample_instance_gain(0x3f40c0c1,part_voice[1]);
      al_set_sample_instance_gain(0x3f40c0c1,part_voice[2]);
      al_set_sample_instance_gain(0x3f800000,part_voice[3]);
      al_set_sample_instance_pan(0,part_voice[0]);
      al_set_sample_instance_pan(0x3f400000,part_voice[1]);
      al_set_sample_instance_pan(0xbf400000,part_voice[2]);
      al_set_sample_instance_pan(0,part_voice[3]);
      music_timer = (ALLEGRO_TIMER *)al_create_timer(0x745d1746);
    }
    al_start_timer(music_timer);
  }
  sound_update_thread = (ALLEGRO_THREAD *)al_create_thread(sound_update_proc,0);
  al_start_thread(sound_update_thread);
  return;
}

Assistant:

void init_sound()
{
   float f, osc1, osc2, freq1, freq2, vol, val;
   char *p;
   int len;
   int i;

   if (!al_is_audio_installed())
      return;

   /* zap (firing sound) consists of multiple falling saw waves */
   len = 8192;
   zap = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(zap);

   osc1 = 0;
   freq1 = 0.02;

   osc2 = 0;
   freq2 = 0.025;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 127;

      *p = 128 + (fmod(osc1, 1) + fmod(osc2, 1) - 1) * vol;

      osc1 += freq1;
      freq1 -= 0.000001;

      osc2 += freq2;
      freq2 -= 0.00000125;

      p++;
   }

   /* bang (explosion) consists of filtered noise */
   len = 8192;
   bang = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(bang);

   val = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 255;
      val = (val * 0.75) + (RAND * 0.25);
      *p = 128 + val * vol;
      p++;
   }

   /* big bang (explosion) consists of noise plus rumble */
   len = 24576;
   bigbang = create_sample_u8(11025, len);

   p = (char *)al_get_sample_data(bigbang);

   val = 0;

   osc1 = 0;
   osc2 = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 128;

      f = 0.5 + ((float)i / (float)len * 0.4);
      val = (val * f) + (RAND * (1-f));

      *p = 128 + (val + (sin(osc1) + sin(osc2)) / 4) * vol;

      osc1 += 0.03;
      osc2 += 0.04;

      p++;
   }

   /* ping consists of two sine waves */
   len = 8192;
   ping = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(ping);

   osc1 = 0;
   osc2 = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 31;

      *p = 128 + (sin(osc1) + sin(osc2) - 1) * vol;

      osc1 += 0.2;
      osc2 += 0.3;

      p++;
   }

   ping_timer = al_create_timer(0.3);

   /* set up my lurvely music player :-) */
   if (!no_music) {
      init_music();
      al_start_timer(music_timer);
   }

   sound_update_thread = al_create_thread(sound_update_proc, NULL);
   al_start_thread(sound_update_thread);
}